

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O3

void * AllocUnits(CPpmd7 *p,uint indx)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void *retVal;
  uint oldIndx;
  int iVar4;
  long lVar5;
  CPpmd_Void_Ref CVar6;
  Byte *pBVar7;
  uint uVar8;
  uint uVar9;
  Byte *pBVar10;
  ulong uVar11;
  ulong uVar12;
  CPpmd_Void_Ref *pCVar13;
  
  uVar12 = (ulong)p->FreeList[indx];
  if (uVar12 != 0) {
    pBVar7 = p->Base;
    p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar7 + uVar12);
    return pBVar7 + uVar12;
  }
  lVar5 = (ulong)p->Indx2Units[indx] * 0xc;
  pBVar7 = p->LoUnit;
  if ((uint)lVar5 <= (uint)(*(int *)&p->HiUnit - (int)pBVar7)) {
    p->LoUnit = pBVar7 + lVar5;
    return pBVar7;
  }
  oldIndx = indx;
  if (p->GlueCount == 0) {
    uVar3 = p->Size + p->AlignOffset;
    p->GlueCount = 0xff;
    lVar5 = 0;
    uVar8 = uVar3;
    do {
      bVar1 = p->Indx2Units[lVar5];
      CVar6 = p->FreeList[lVar5];
      p->FreeList[lVar5] = 0;
      if (CVar6 != 0) {
        pBVar7 = p->Base;
        uVar9 = uVar8;
        do {
          uVar8 = CVar6;
          *(uint *)(pBVar7 + (ulong)uVar8 + 4) = uVar9;
          *(uint *)(pBVar7 + (ulong)uVar9 + 8) = uVar8;
          CVar6 = *(CPpmd_Void_Ref *)(pBVar7 + uVar8);
          (pBVar7 + uVar8)[0] = '\0';
          (pBVar7 + uVar8)[1] = '\0';
          *(ushort *)(pBVar7 + (ulong)uVar8 + 2) = (ushort)bVar1;
          uVar9 = uVar8;
        } while (CVar6 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x26);
    pBVar7 = p->Base;
    (pBVar7 + uVar3)[0] = '\x01';
    (pBVar7 + uVar3)[1] = '\0';
    *(uint *)(pBVar7 + (ulong)uVar3 + 4) = uVar8;
    *(uint *)(pBVar7 + (ulong)uVar8 + 8) = uVar3;
    pBVar10 = p->LoUnit;
    if (pBVar10 != p->HiUnit) {
      pBVar10[0] = '\x01';
      pBVar10[1] = '\0';
    }
    if (uVar8 != uVar3) {
      do {
        uVar12 = (ulong)uVar8;
        uVar11 = (ulong)*(ushort *)(pBVar7 + uVar12 + 2);
        uVar8 = (uint)*(ushort *)(pBVar7 + uVar11 * 0xc + uVar12 + 2) +
                (uint)*(ushort *)(pBVar7 + uVar12 + 2);
        if (uVar8 < 0x10000 && *(short *)(pBVar7 + uVar11 * 0xc + uVar12) == 0) {
          pBVar10 = pBVar7 + uVar11 * 0xc + uVar12;
          do {
            uVar9 = *(uint *)(pBVar10 + 4);
            uVar2 = *(uint *)(pBVar10 + 8);
            *(uint *)(pBVar7 + (ulong)uVar2 + 4) = uVar9;
            *(uint *)(pBVar7 + (ulong)uVar9 + 8) = uVar2;
            *(short *)(pBVar7 + uVar12 + 2) = (short)uVar8;
            if (*(short *)(pBVar7 + (ulong)uVar8 * 0xc + uVar12) != 0) break;
            pBVar10 = pBVar7 + (ulong)uVar8 * 0xc + uVar12;
            uVar8 = uVar8 + *(ushort *)(pBVar10 + 2);
          } while (uVar8 < 0x10000);
        }
        uVar8 = *(uint *)(pBVar7 + uVar12 + 4);
      } while (uVar8 != uVar3);
      uVar8 = *(uint *)(pBVar7 + (ulong)uVar3 + 4);
      while (uVar8 != uVar3) {
        uVar12 = (ulong)uVar8;
        pCVar13 = (CPpmd_Void_Ref *)(pBVar7 + uVar12);
        uVar8 = *(uint *)(pBVar7 + uVar12 + 4);
        uVar9 = (uint)*(ushort *)(pBVar7 + uVar12 + 2);
        iVar4 = (int)pBVar7;
        if (0x80 < *(ushort *)(pBVar7 + uVar12 + 2)) {
          CVar6 = p->FreeList[0x25];
          do {
            *(CPpmd_Void_Ref *)(pBVar7 + uVar12) = CVar6;
            CVar6 = (int)pCVar13 - iVar4;
            p->FreeList[0x25] = (CPpmd_Void_Ref)uVar12;
            uVar9 = uVar9 - 0x80;
            pCVar13 = pCVar13 + 0x180;
            uVar12 = uVar12 + 0x600;
          } while (0x80 < uVar9);
          pCVar13 = (CPpmd_Void_Ref *)(pBVar7 + uVar12);
        }
        uVar12 = (ulong)p->Units2Indx[uVar9 - 1];
        if (uVar9 != p->Indx2Units[uVar12]) {
          uVar12 = (ulong)(p->Units2Indx[uVar9 - 1] - 1);
          bVar1 = p->Indx2Units[uVar12];
          uVar9 = uVar9 + ~(uint)bVar1;
          pCVar13[(ulong)bVar1 * 3] = p->FreeList[uVar9];
          p->FreeList[uVar9] = (int)(pCVar13 + (ulong)bVar1 * 3) - iVar4;
        }
        *pCVar13 = p->FreeList[uVar12];
        p->FreeList[uVar12] = (int)pCVar13 - iVar4;
      }
    }
    uVar12 = (ulong)p->FreeList[indx];
    if (uVar12 != 0) {
      p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar7 + uVar12);
      return pBVar7 + uVar12;
    }
  }
  do {
    if (oldIndx == 0x25) {
      bVar1 = p->Indx2Units[indx];
      p->GlueCount = p->GlueCount - 1;
      if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
        pBVar7 = p->UnitsStart + (ulong)bVar1 * -0xc;
        p->UnitsStart = pBVar7;
        return pBVar7;
      }
      return (void *)0x0;
    }
    oldIndx = oldIndx + 1;
    uVar12 = (ulong)p->FreeList[oldIndx];
  } while (uVar12 == 0);
  pBVar7 = p->Base + uVar12;
  p->FreeList[oldIndx] = *(CPpmd_Void_Ref *)(p->Base + uVar12);
  SplitBlock(p,pBVar7,oldIndx,indx);
  return pBVar7;
}

Assistant:

static void *AllocUnits(CPpmd7 *p, unsigned indx)
{
  UInt32 numBytes;
  if (p->FreeList[indx] != 0)
    return RemoveNode(p, indx);
  numBytes = U2B(I2U(indx));
  if (numBytes <= (UInt32)(p->HiUnit - p->LoUnit))
  {
    void *retVal = p->LoUnit;
    p->LoUnit += numBytes;
    return retVal;
  }
  return AllocUnitsRare(p, indx);
}